

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void free_cdef_bufs(uint16_t **colbuf,uint16_t **srcbuf)

{
  int plane;
  long lVar1;
  
  aom_free(*srcbuf);
  *srcbuf = (uint16_t *)0x0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    aom_free(colbuf[lVar1]);
    colbuf[lVar1] = (uint16_t *)0x0;
  }
  return;
}

Assistant:

static inline void free_cdef_bufs(uint16_t **colbuf, uint16_t **srcbuf) {
  aom_free(*srcbuf);
  *srcbuf = NULL;
  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    aom_free(colbuf[plane]);
    colbuf[plane] = NULL;
  }
}